

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O2

void __thiscall
booster::callback<void(std::error_code_const&)>::
callback<cppcms::util::details::binderX<cppcms::session_pool::gc_job,std::shared_ptr<cppcms::session_pool::gc_job>,std::error_code_const&>>
          (callback<void(std::error_code_const&)> *this,
          binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>
          *func)

{
  callable_impl<void,_cppcms::util::details::binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>_>
  *this_00;
  binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>
  bStack_48;
  
  this_00 = (callable_impl<void,_cppcms::util::details::binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>_>
             *)operator_new(0x30);
  cppcms::util::details::
  binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>
  ::binderX(&bStack_48,func);
  callback<void_(const_std::error_code_&)>::
  callable_impl<void,_cppcms::util::details::binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>_>
  ::callable_impl(this_00,&bStack_48);
  *(callable_impl<void,_cppcms::util::details::binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>_>
    **)this = this_00;
  booster::atomic_counter::inc();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&bStack_48.object.
              super___shared_ptr<cppcms::session_pool::gc_job,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}